

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O0

void PrintType(InstructionVMGraphContext *ctx,VmType type)

{
  bool bVar1;
  InstructionVMGraphContext *ctx_local;
  VmType type_local;
  
  type_local._0_8_ = type.structType;
  ctx_local = type._0_8_;
  bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Void);
  if (bVar1) {
    Print(ctx,"void");
  }
  else {
    bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Int);
    if (bVar1) {
      Print(ctx,"int");
    }
    else {
      bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Double);
      if (bVar1) {
        Print(ctx,"double");
      }
      else {
        bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Long);
        if (bVar1) {
          Print(ctx,"long");
        }
        else {
          bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Block);
          if (bVar1) {
            Print(ctx,"label");
          }
          else {
            bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::Function);
            if (bVar1) {
              Print(ctx,"function");
            }
            else if ((int)ctx_local == 6) {
              Print(ctx,"ptr");
            }
            else if ((int)ctx_local == 7) {
              Print(ctx,"func_ref");
            }
            else if ((int)ctx_local == 8) {
              Print(ctx,"array_ref");
            }
            else {
              bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::AutoRef);
              if (bVar1) {
                Print(ctx,"auto ref");
              }
              else {
                bVar1 = VmType::operator==((VmType *)&ctx_local,&VmType::AutoArray);
                if (bVar1) {
                  Print(ctx,"auto[]");
                }
                else {
                  if ((int)ctx_local != 0xb) {
                    __assert_fail("!\"unknown type\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                                  ,0x54,"void PrintType(InstructionVMGraphContext &, VmType)");
                  }
                  Print(ctx,"%.*s",
                        (ulong)(uint)((int)*(undefined8 *)(type_local._0_8_ + 0x18) -
                                     (int)*(undefined8 *)(type_local._0_8_ + 0x10)),
                        *(undefined8 *)(type_local._0_8_ + 0x10));
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void PrintType(InstructionVMGraphContext &ctx, VmType type)
{
	if(type == VmType::Void)
		Print(ctx, "void");
	else if(type == VmType::Int)
		Print(ctx, "int");
	else if(type == VmType::Double)
		Print(ctx, "double");
	else if(type == VmType::Long)
		Print(ctx, "long");
	else if(type == VmType::Block)
		Print(ctx, "label");
	else if(type == VmType::Function)
		Print(ctx, "function");
	else if(type.type == VM_TYPE_POINTER)
		Print(ctx, "ptr");
	else if(type.type == VM_TYPE_FUNCTION_REF)
		Print(ctx, "func_ref");
	else if(type.type == VM_TYPE_ARRAY_REF)
		Print(ctx, "array_ref");
	else if(type == VmType::AutoRef)
		Print(ctx, "auto ref");
	else if(type == VmType::AutoArray)
		Print(ctx, "auto[]");
	else if(type.type == VM_TYPE_STRUCT)
		Print(ctx, "%.*s", FMT_ISTR(type.structType->name));
	else
		assert(!"unknown type");
}